

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.cc
# Opt level: O0

void re2::RandomTest(int maxatoms,int maxops,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *alphabet,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *ops,int maxstrlen,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *stralphabet,string *wrapper)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  ostream *poVar6;
  LogMessage local_308;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [8];
  ExhaustiveTester t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *stralphabet_local;
  int maxstrlen_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ops_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *alphabet_local;
  int maxops_local;
  int maxatoms_local;
  
  t._280_8_ = stralphabet;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"",&local_171);
  ExhaustiveTester::ExhaustiveTester
            ((ExhaustiveTester *)local_150,maxatoms + -1,maxops + -1,alphabet,ops,maxstrlen / 2,
             stralphabet,wrapper,(string *)local_170);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  ExhaustiveTester::RandomStrings((ExhaustiveTester *)local_150,FLAGS_stringseed,FLAGS_stringcount);
  RegexpGenerator::GenerateRandom((RegexpGenerator *)local_150,FLAGS_regexpseed,FLAGS_regexpcount);
  uVar1 = ExhaustiveTester::regexps((ExhaustiveTester *)local_150);
  uVar2 = ExhaustiveTester::tests((ExhaustiveTester *)local_150);
  uVar3 = ExhaustiveTester::failures((ExhaustiveTester *)local_150);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)t._280_8_);
  printf("%d regexps, %d tests, %d failures [%d/%d str]\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
         (ulong)(uint)(maxstrlen / 2),sVar5 & 0xffffffff);
  iVar4 = ExhaustiveTester::failures((ExhaustiveTester *)local_150);
  if (iVar4 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/random_test.cc"
               ,0x28);
    poVar6 = LogMessage::stream(&local_308);
    std::operator<<(poVar6,"Check failed: (0) == (t.failures())");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_308);
  }
  ExhaustiveTester::~ExhaustiveTester((ExhaustiveTester *)local_150);
  return;
}

Assistant:

static void RandomTest(int maxatoms, int maxops,
                       const vector<string>& alphabet,
                       const vector<string>& ops,
                       int maxstrlen, const vector<string>& stralphabet,
                       const string& wrapper) {
  // Limit to smaller test cases in debug mode,
  // because everything is so much slower.
  if (RE2_DEBUG_MODE) {
    maxatoms--;
    maxops--;
    maxstrlen /= 2;
  }

  ExhaustiveTester t(maxatoms, maxops, alphabet, ops,
                     maxstrlen, stralphabet, wrapper, "");
  t.RandomStrings(FLAGS_stringseed, FLAGS_stringcount);
  t.GenerateRandom(FLAGS_regexpseed, FLAGS_regexpcount);
  printf("%d regexps, %d tests, %d failures [%d/%d str]\n",
         t.regexps(), t.tests(), t.failures(), maxstrlen, (int)stralphabet.size());
  EXPECT_EQ(0, t.failures());
}